

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *data;
  long lVar1;
  FILE *pFVar2;
  size_t __ptr;
  ptrdiff_t size;
  int iVar3;
  char *pcVar4;
  BigAttr *pBVar5;
  BigAttr *pBVar6;
  void *pvVar7;
  int iVar8;
  undefined4 uVar9;
  long alStack_3e0 [3];
  FILE *local_3c8 [4];
  int local_3a4;
  char *local_3a0;
  FILE *local_398;
  ulong local_390;
  long local_388;
  FILE *local_380;
  FILE *local_378;
  FILE *local_370;
  int local_364;
  undefined1 local_360 [8];
  BigArray array;
  ptrdiff_t offset;
  BigBlockPtr ptrnew;
  size_t chunksize;
  BigAttr *attr;
  BigAttr *attrs;
  size_t nattr;
  ulong uStack_f8;
  int i;
  unsigned_long __vla_expr0;
  char *local_e8;
  char *newfile;
  size_t buffersize;
  int local_d0;
  int Nfile;
  int ch;
  int verbose;
  BigBlock bbnew;
  BigBlock bb;
  BigFile bfnew;
  BigFile bf;
  char **argv_local;
  int argc_local;
  undefined1 auVar10 [16];
  
  alStack_3e0[2] = 0x102409;
  memset(&bfnew,0,8);
  alStack_3e0[2] = 0x102419;
  memset(&bb.dirty,0,8);
  alStack_3e0[2] = 0x102429;
  memset(&bbnew.dirty,0,0x50);
  alStack_3e0[2] = 0x10243c;
  memset(&ch,0,0x50);
  Nfile = 0;
  buffersize._4_4_ = -1;
  newfile = (char *)0x10000000;
  local_e8 = (char *)0x0;
  while( true ) {
    alStack_3e0[2] = 0x102479;
    local_d0 = getopt(argc,argv,"n:vB:f:");
    if (local_d0 == -1) break;
    local_364 = local_d0;
    if (local_d0 == 0x42) {
      alStack_3e0[2] = 0x102511;
      __isoc99_sscanf(_optarg,"%td",&newfile);
    }
    else if (local_d0 == 0x66) {
      local_e8 = _optarg;
    }
    else if (local_d0 == 0x6e) {
      alStack_3e0[2] = 0x1024ea;
      buffersize._4_4_ = atoi(_optarg);
    }
    else if (local_d0 == 0x76) {
      Nfile = 1;
    }
    else {
      alStack_3e0[2] = 0x102524;
      usage();
    }
  }
  if (argc - _optind != 3) {
    alStack_3e0[2] = 0x102542;
    usage();
  }
  iVar8 = _optind + -1;
  alStack_3e0[2] = 0x102571;
  iVar3 = big_file_open(&bfnew,argv[(long)iVar8 + 1]);
  if (iVar3 != 0) {
    local_370 = _stderr;
    alStack_3e0[2] = 0x10258f;
    pcVar4 = big_file_get_error_message();
    alStack_3e0[2] = 0x1025a7;
    fprintf(local_370,"failed to open: %s\n",pcVar4);
    alStack_3e0[2] = 0x1025b1;
    exit(1);
  }
  if (local_e8 == (char *)0x0) {
    local_e8 = argv[(long)iVar8 + 1];
  }
  alStack_3e0[2] = 0x1025da;
  iVar3 = big_file_create((BigFile *)&bb.dirty,local_e8);
  if (iVar3 != 0) {
    local_378 = _stderr;
    alStack_3e0[2] = 0x1025f8;
    pcVar4 = big_file_get_error_message();
    alStack_3e0[2] = 0x102610;
    fprintf(local_378,"failed to open: %s\n",pcVar4);
    alStack_3e0[2] = 0x10261a;
    exit(1);
  }
  alStack_3e0[2] = 0x10262f;
  iVar3 = big_file_open_block(&bfnew,(BigBlock *)&bbnew.dirty,argv[(long)iVar8 + 2]);
  uVar9 = bb.dtype._0_4_;
  if (iVar3 != 0) {
    local_380 = _stderr;
    alStack_3e0[2] = 0x10264d;
    pcVar4 = big_file_get_error_message();
    alStack_3e0[2] = 0x102665;
    fprintf(local_380,"failed to open: %s\n",pcVar4);
    alStack_3e0[2] = 0x10266f;
    exit(1);
  }
  if ((buffersize._4_4_ == -1) || ((int)bb.fchecksum == 0)) {
    buffersize._4_4_ = (int)bb.fchecksum;
  }
  iVar3 = buffersize._4_4_;
  __vla_expr0 = (unsigned_long)local_3c8;
  lVar1 = -((ulong)(buffersize._4_4_ + 10) * 8 + 0xf & 0xfffffffffffffff0);
  local_388 = (long)local_3c8 + lVar1;
  uStack_f8 = (ulong)(buffersize._4_4_ + 10);
  for (nattr._4_4_ = 0; nattr._4_4_ < buffersize._4_4_; nattr._4_4_ = nattr._4_4_ + 1) {
    local_390 = (ulong)((long)(nattr._4_4_ + 1) * (long)bb.basename) / (ulong)(long)buffersize._4_4_
    ;
    *(ulong *)(local_388 + (long)nattr._4_4_ * 8) =
         local_390 - (ulong)((long)nattr._4_4_ * (long)bb.basename) / (ulong)(long)buffersize._4_4_;
  }
  pcVar4 = argv[(long)iVar8 + 3];
  *(long *)((long)alStack_3e0 + lVar1 + 8) = local_388;
  *(undefined8 *)((long)alStack_3e0 + lVar1) = 0x102776;
  iVar3 = big_file_create_block
                    ((BigFile *)&bb.dirty,(BigBlock *)&ch,pcVar4,(char *)&bbnew.dirty,uVar9,iVar3,
                     *(size_t **)((long)alStack_3e0 + lVar1 + 8));
  if (iVar3 == 0) {
    if (bbnew.basename != bb.basename) {
      *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1027cc;
      abort();
    }
    *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1027dc;
    pBVar5 = big_block_list_attrs((BigBlock *)&bbnew.dirty,(size_t *)&attrs);
    for (nattr._4_4_ = 0; (BigAttr *)(long)nattr._4_4_ < attrs; nattr._4_4_ = nattr._4_4_ + 1) {
      pBVar6 = pBVar5 + nattr._4_4_;
      pcVar4 = pBVar6->name;
      data = pBVar6->data;
      iVar3 = pBVar6->nmemb;
      *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102850;
      big_block_set_attr((BigBlock *)&ch,pcVar4,data,pBVar6->dtype,iVar3);
    }
    if ((0 < (int)bb.dtype._0_4_) && (bb.basename != (char *)0x0)) {
      local_3a0 = newfile;
      local_3a4._0_1_ = bb.dtype[0];
      local_3a4._1_1_ = bb.dtype[1];
      local_3a4._2_1_ = bb.dtype[2];
      local_3a4._3_1_ = bb.dtype[3];
      *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102896;
      iVar3 = big_file_dtype_itemsize((char *)&bbnew.dirty);
      ptrnew.aoffset = (ulong)local_3a0 / (ulong)(long)(local_3a4 * iVar3);
      array.data = (void *)0x0;
      while (size = ptrnew.aoffset, pvVar7 = array.data, array.data < bb.basename) {
        *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1028f6;
        iVar3 = big_block_read_simple
                          ((BigBlock *)&bbnew.dirty,(ptrdiff_t)pvVar7,size,(BigArray *)local_360,
                           (char *)0x0);
        pvVar7 = array.data;
        if (iVar3 != 0) {
          local_3c8[3] = _stderr;
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102914;
          pcVar4 = big_file_get_error_message();
          pFVar2 = local_3c8[3];
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x10292c;
          fprintf(pFVar2,"failed to read original: %s\n",pcVar4);
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102936;
          exit(1);
        }
        *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102950;
        iVar3 = big_block_seek((BigBlock *)&ch,(BigBlockPtr *)&offset,(ptrdiff_t)pvVar7);
        if (iVar3 != 0) {
          local_3c8[2] = _stderr;
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x10296e;
          pcVar4 = big_file_get_error_message();
          pFVar2 = local_3c8[2];
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102986;
          fprintf(pFVar2,"failed to seek new: %s\n",pcVar4);
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102990;
          exit(1);
        }
        *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1029aa;
        iVar3 = big_block_write((BigBlock *)&ch,(BigBlockPtr *)&offset,(BigArray *)local_360);
        __ptr = array.size;
        if (iVar3 != 0) {
          local_3c8[1] = _stderr;
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1029c8;
          pcVar4 = big_file_get_error_message();
          pFVar2 = local_3c8[1];
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1029e0;
          fprintf(pFVar2,"failed to write new: %s\n",pcVar4);
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1029ea;
          exit(1);
        }
        *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1029f6;
        free((void *)__ptr);
        pvVar7 = (void *)(array._8_8_ + (long)array.data);
        array.data = pvVar7;
        if (Nfile != 0) {
          auVar10._8_4_ = (int)((ulong)bb.basename >> 0x20);
          auVar10._0_8_ = bb.basename;
          auVar10._12_4_ = 0x45300000;
          uVar9 = SUB84(bb.basename,0);
          *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102a77;
          fprintf(_stderr,"%td / %td done (%0.4g%%)\r",
                  (100.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar9) - 4503599627370496.0))) *
                  (double)(long)pvVar7,pvVar7);
        }
      }
    }
    *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102a8a;
    iVar3 = big_block_close((BigBlock *)&ch);
    if (iVar3 == 0) {
      *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102ad3;
      big_block_close((BigBlock *)&bbnew.dirty);
      *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102adc;
      big_file_close(&bfnew);
      *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102ae5;
      big_file_close((BigFile *)&bb.dirty);
      return 0;
    }
    local_3c8[0] = _stderr;
    *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102aa8;
    pcVar4 = big_file_get_error_message();
    pFVar2 = local_3c8[0];
    *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102ac0;
    fprintf(pFVar2,"failed to close new: %s\n",pcVar4);
    *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102aca;
    exit(1);
  }
  local_398 = _stderr;
  *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x102798;
  pcVar4 = big_file_get_error_message();
  pFVar2 = local_398;
  *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1027b0;
  fprintf(pFVar2,"failed to create temp: %s\n",pcVar4);
  *(undefined8 *)((long)alStack_3e0 + lVar1 + 0x10) = 0x1027ba;
  exit(1);
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigFile bfnew = {0};
    BigBlock bb = {0};
    BigBlock bbnew = {0};
    int verbose = 0;
    int ch;
    int Nfile = -1;
    size_t buffersize = 256 * 1024 * 1024;
    char * newfile = NULL;
    while(-1 != (ch = getopt(argc, argv, "n:vB:f:"))) {
        switch(ch) {
            case 'f':
                newfile = optarg;
                break;
            case 'n':
                Nfile = atoi(optarg);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            case 'v':
                verbose = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind + 1 != 4) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(newfile == NULL) {
        newfile = argv[1];
    }
    if(0 != big_file_create(&bfnew, newfile)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(Nfile == -1 || bb.Nfile == 0) {
        Nfile = bb.Nfile;
    }
    /* avoid Nfile == 0 */
    size_t newsize[Nfile + 10];
    int i;
    for(i = 0; i < Nfile; i ++) {
        newsize[i] = (i + 1) * bb.size / Nfile
            - i * bb.size / Nfile;
    }

    if(0 != big_file_create_block(&bfnew, &bbnew, argv[3], bb.dtype, bb.nmemb, Nfile, newsize)) {
        fprintf(stderr, "failed to create temp: %s\n", big_file_get_error_message());
        exit(1);
    }

    if(bbnew.size != bb.size) {
        abort();
    }

    /* copy attrs */
    size_t nattr;
    BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
    for(i = 0; i < nattr; i ++) {
        BigAttr * attr = &attrs[i];
        big_block_set_attr(&bbnew, attr->name, attr->data, attr->dtype, attr->nmemb);
    }
    
    if(bb.nmemb > 0 && bb.size > 0) {
        /* copy data */
        size_t chunksize = buffersize / (bb.nmemb * dtype_itemsize(bb.dtype));
        BigBlockPtr ptrnew;
        ptrdiff_t offset;
        BigArray array;

        for(offset = 0; offset < bb.size; ) {
            if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
                fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
                exit(1);
            }
            if(0 != big_block_seek(&bbnew, &ptrnew, offset)) {
                fprintf(stderr, "failed to seek new: %s\n", big_file_get_error_message());
                exit(1);
            }

            if(0 != big_block_write(&bbnew, &ptrnew, &array)) {
                fprintf(stderr, "failed to write new: %s\n", big_file_get_error_message());
                exit(1);
            }

            free(array.data);
            offset += array.dims[0];
            if(verbose) {
                fprintf(stderr, "%td / %td done (%0.4g%%)\r", offset, bb.size, (100. / bb.size) * offset);
            }
        }
    }
    if(0 != big_block_close(&bbnew)) {
        fprintf(stderr, "failed to close new: %s\n", big_file_get_error_message());
        exit(1);
    }
    big_block_close(&bb);
    big_file_close(&bf);
    big_file_close(&bfnew);
    return 0;
}